

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

void __thiscall
cmComputeTargetDepends::ComplainAboutBadComponent
          (cmComputeTargetDepends *this,cmComputeComponentGraph *ccg,int c,bool strong)

{
  int iVar1;
  cmGeneratorTarget *this_00;
  bool bVar2;
  TargetType targetType;
  ostream *poVar3;
  vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_> *this_01;
  vector<int,_std::allocator<int>_> *this_02;
  reference piVar4;
  reference ppcVar5;
  string *psVar6;
  reference this_03;
  const_reference pvVar7;
  pointer this_04;
  char *pcVar8;
  string local_228 [32];
  cmGeneratorTarget *local_208;
  cmGeneratorTarget *dependee;
  const_iterator cStack_1f8;
  int j;
  __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
  local_1f0;
  const_iterator ni;
  EdgeList *nl;
  cmGeneratorTarget *depender;
  const_iterator cStack_1d0;
  int i;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_1c8;
  const_iterator ci;
  NodeList *cl;
  vector<int,_std::allocator<int>_> *cmap;
  vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_> *components;
  undefined1 local_198 [8];
  ostringstream e;
  bool strong_local;
  int c_local;
  cmComputeComponentGraph *ccg_local;
  cmComputeTargetDepends *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  poVar3 = std::operator<<((ostream *)local_198,
                           "The inter-target dependency graph contains the following ");
  std::operator<<(poVar3,"strongly connected component (cycle):\n");
  this_01 = cmComputeComponentGraph::GetComponents(ccg);
  this_02 = cmComputeComponentGraph::GetComponentMap(ccg);
  ci._M_current =
       (int *)std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::operator[]
                        (this_01,(long)c);
  local_1c8._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)ci._M_current);
  while( true ) {
    cStack_1d0 = std::vector<int,_std::allocator<int>_>::end(ci._M_current);
    bVar2 = __gnu_cxx::operator!=(&local_1c8,&stack0xfffffffffffffe30);
    if (!bVar2) break;
    piVar4 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&local_1c8);
    iVar1 = *piVar4;
    ppcVar5 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
              operator[](&this->Targets,(long)iVar1);
    this_00 = *ppcVar5;
    poVar3 = std::operator<<((ostream *)local_198,"  \"");
    psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
    poVar3 = std::operator<<(poVar3,(string *)psVar6);
    poVar3 = std::operator<<(poVar3,"\" of type ");
    targetType = cmGeneratorTarget::GetType(this_00);
    pcVar8 = cmState::GetTargetTypeName(targetType);
    poVar3 = std::operator<<(poVar3,pcVar8);
    std::operator<<(poVar3,"\n");
    ni._M_current =
         (cmGraphEdge *)
         std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                   (&(this->InitialGraph).
                     super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,(long)iVar1);
    local_1f0._M_current =
         (cmGraphEdge *)
         std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::begin
                   ((vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *)ni._M_current);
    while( true ) {
      cStack_1f8 = std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::end(ni._M_current);
      bVar2 = __gnu_cxx::operator!=(&local_1f0,&stack0xfffffffffffffe08);
      if (!bVar2) break;
      this_03 = __gnu_cxx::
                __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                ::operator*(&local_1f0);
      dependee._4_4_ = cmGraphEdge::operator_cast_to_int(this_03);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](this_02,(long)dependee._4_4_);
      if (*pvVar7 == c) {
        ppcVar5 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                  ::operator[](&this->Targets,(long)dependee._4_4_);
        local_208 = *ppcVar5;
        poVar3 = std::operator<<((ostream *)local_198,"    depends on \"");
        psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(local_208);
        poVar3 = std::operator<<(poVar3,(string *)psVar6);
        poVar3 = std::operator<<(poVar3,"\"");
        poVar3 = std::operator<<(poVar3," (");
        this_04 = __gnu_cxx::
                  __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                  ::operator->(&local_1f0);
        bVar2 = cmGraphEdge::IsStrong(this_04);
        pcVar8 = "weak";
        if (bVar2) {
          pcVar8 = "strong";
        }
        poVar3 = std::operator<<(poVar3,pcVar8);
        std::operator<<(poVar3,")\n");
      }
      __gnu_cxx::
      __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
      ::operator++(&local_1f0);
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_1c8);
  }
  if (strong) {
    poVar3 = std::operator<<((ostream *)local_198,
                             "The component contains at least one cycle consisting of strong ");
    std::operator<<(poVar3,"dependencies (created by add_dependencies) that cannot be broken.");
  }
  else if ((this->NoCycles & 1U) == 0) {
    poVar3 = std::operator<<((ostream *)local_198,
                             "At least one of these targets is not a STATIC_LIBRARY.  ");
    std::operator<<(poVar3,"Cyclic dependencies are allowed only among static libraries.");
  }
  else {
    poVar3 = std::operator<<((ostream *)local_198,
                             "The GLOBAL_DEPENDS_NO_CYCLES global property is enabled, so ");
    std::operator<<(poVar3,"cyclic dependencies are not allowed even among static libraries.");
  }
  std::__cxx11::ostringstream::str();
  pcVar8 = (char *)std::__cxx11::string::c_str();
  cmSystemTools::Error(pcVar8,(char *)0x0,(char *)0x0,(char *)0x0);
  std::__cxx11::string::~string(local_228);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return;
}

Assistant:

void cmComputeTargetDepends::ComplainAboutBadComponent(
  cmComputeComponentGraph const& ccg, int c, bool strong)
{
  // Construct the error message.
  std::ostringstream e;
  e << "The inter-target dependency graph contains the following "
    << "strongly connected component (cycle):\n";
  std::vector<NodeList> const& components = ccg.GetComponents();
  std::vector<int> const& cmap = ccg.GetComponentMap();
  NodeList const& cl = components[c];
  for (NodeList::const_iterator ci = cl.begin(); ci != cl.end(); ++ci) {
    // Get the depender.
    int i = *ci;
    cmGeneratorTarget const* depender = this->Targets[i];

    // Describe the depender.
    e << "  \"" << depender->GetName() << "\" of type "
      << cmState::GetTargetTypeName(depender->GetType()) << "\n";

    // List its dependencies that are inside the component.
    EdgeList const& nl = this->InitialGraph[i];
    for (EdgeList::const_iterator ni = nl.begin(); ni != nl.end(); ++ni) {
      int j = *ni;
      if (cmap[j] == c) {
        cmGeneratorTarget const* dependee = this->Targets[j];
        e << "    depends on \"" << dependee->GetName() << "\""
          << " (" << (ni->IsStrong() ? "strong" : "weak") << ")\n";
      }
    }
  }
  if (strong) {
    // Custom command executable dependencies cannot occur within a
    // component of static libraries.  The cycle must appear in calls
    // to add_dependencies.
    e << "The component contains at least one cycle consisting of strong "
      << "dependencies (created by add_dependencies) that cannot be broken.";
  } else if (this->NoCycles) {
    e << "The GLOBAL_DEPENDS_NO_CYCLES global property is enabled, so "
      << "cyclic dependencies are not allowed even among static libraries.";
  } else {
    e << "At least one of these targets is not a STATIC_LIBRARY.  "
      << "Cyclic dependencies are allowed only among static libraries.";
  }
  cmSystemTools::Error(e.str().c_str());
}